

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O0

ParseOutput __thiscall
helics::helicsCLI11App::helics_parse<std::__cxx11::string>
          (helicsCLI11App *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  Option *this_00;
  size_t sVar1;
  char (*__args) [9];
  long in_RDI;
  CallForHelp *ch;
  CallForAllHelp *ca;
  CallForVersion *cv;
  Success *anon_var_0;
  Error *ce;
  Option *opt;
  bool in_stack_00000187;
  string *in_stack_00000188;
  App *in_stack_00000190;
  value_type *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff10;
  App *this_01;
  allocator<char> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  allocator<char> local_81;
  string *in_stack_ffffffffffffff80;
  App *in_stack_ffffffffffffff88;
  
  this_01 = (App *)&stack0xffffffffffffffd0;
  std::__cxx11::string::string(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  CLI::App::parse(in_stack_00000190,in_stack_00000188,in_stack_00000187);
  std::__cxx11::string::~string(in_stack_ffffffffffffff00);
  *(undefined4 *)(in_RDI + 0x364) = 0;
  CLI::App::remaining_for_passthrough_abi_cxx11_(this_01,SUB81((ulong)in_RDI >> 0x38,0));
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffff10);
  if ((*(byte *)(in_RDI + 0x361) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30
              );
    this_00 = CLI::App::get_option_no_throw(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::__cxx11::string::~string(in_stack_ffffffffffffff00);
    std::allocator<char>::~allocator(&local_81);
    if ((this_00 != (Option *)0x0) && (sVar1 = CLI::Option::count((Option *)0x44fafd), sVar1 != 0))
    {
      __args = (char (*) [9])(in_RDI + 0x380);
      CLI::Option::as<std::__cxx11::string>((Option *)this_01);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      std::__cxx11::string::~string(in_stack_ffffffffffffff00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[9]>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00,__args);
    }
  }
  return *(ParseOutput *)(in_RDI + 0x364);
}

Assistant:

ParseOutput helics_parse(Args&&... args) noexcept
    {
        try {
            parse(std::forward<Args>(args)...);
            last_output = ParseOutput::OK;
            remArgs = remaining_for_passthrough();
            if (passConfig) {
                auto* opt = get_option_no_throw("--config");
                if (opt != nullptr && opt->count() > 0) {
                    remArgs.push_back(opt->as<std::string>());
                    remArgs.emplace_back("--config");
                }
            }
        }
        catch (const CLI::CallForHelp& ch) {
            if (!quiet) {
                exit(ch);
            }
            last_output = ParseOutput::HELP_CALL;
        }
        catch (const CLI::CallForAllHelp& ca) {
            if (!quiet) {
                exit(ca);
            }
            last_output = ParseOutput::HELP_ALL_CALL;
        }
        catch (const CLI::CallForVersion& cv) {
            if (!quiet) {
                exit(cv);
            }
            last_output = ParseOutput::VERSION_CALL;
        }
        catch (const CLI::Success& /*sc*/) {
            last_output = ParseOutput::SUCCESS_TERMINATION;
        }
        catch (const CLI::Error& ce) {
            CLI::App::exit(ce);
            last_output = ParseOutput::PARSE_ERROR;
        }
        catch (...) {
            last_output = ParseOutput::PARSE_ERROR;
        }
        return last_output;
    }